

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::WildcardUdpPortListSyntax::setChild
          (WildcardUdpPortListSyntax *this,size_t index,TokenOrSyntax child)

{
  long in_RSI;
  
  (*(code *)(&DAT_00c78dec + *(int *)(&DAT_00c78dec + in_RSI * 4)))();
  return;
}

Assistant:

void WildcardUdpPortListSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: openParen = child.token(); return;
        case 1: dot = child.token(); return;
        case 2: star = child.token(); return;
        case 3: closeParen = child.token(); return;
        case 4: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}